

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::FunctionBody::CreateConstantTable(FunctionBody *this)

{
  code *pcVar1;
  bool bVar2;
  RegSlot RVar3;
  Type *pTVar4;
  undefined4 *puVar5;
  Recycler *pRVar6;
  WriteBarrierPtr<void> *constTable;
  RootObjectBase *var;
  JavascriptLibrary *this_00;
  RecyclableObject *var_00;
  RootObjectBase *rootObject;
  TrackAllocData local_38;
  FunctionBody *local_10;
  FunctionBody *this_local;
  
  local_10 = this;
  pTVar4 = GetConstTable(this);
  if (pTVar4 != (Type *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1103,"(this->GetConstTable() == nullptr)",
                                "this->GetConstTable() == nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  RVar3 = GetConstantCount(this);
  if (RVar3 < 2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1104,"(GetConstantCount() > FirstRegSlot)",
                                "GetConstantCount() > FirstRegSlot");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  pRVar6 = ScriptContext::GetRecycler
                     ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext);
  RVar3 = GetConstantCount(this);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_38,(type_info *)&Memory::WriteBarrierPtr<void>::typeinfo,0,(ulong)RVar3,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
             ,0x1106);
  pRVar6 = Memory::Recycler::TrackAllocInfo(pRVar6,&local_38);
  RVar3 = GetConstantCount(this);
  constTable = Memory::AllocateArray<Memory::Recycler,Memory::WriteBarrierPtr<void>,false>
                         ((Memory *)pRVar6,(Recycler *)Memory::Recycler::AllocZero,0,(ulong)RVar3);
  SetConstTable(this,constTable);
  var = LoadRootObject(this);
  if (var == (RootObjectBase *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Base/FunctionBody.cpp"
                                ,0x1110,"(false)","false");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
    this_00 = ScriptContext::GetLibrary
                        ((this->super_ParseableFunctionInfo).super_FunctionProxy.m_scriptContext);
    var_00 = JavascriptLibraryBase::GetUndefined(&this_00->super_JavascriptLibraryBase);
    RecordConstant(this,1,var_00);
  }
  else {
    RecordConstant(this,1,var);
  }
  return;
}

Assistant:

void FunctionBody::CreateConstantTable()
    {
        Assert(this->GetConstTable() == nullptr);
        Assert(GetConstantCount() > FirstRegSlot);

        this->SetConstTable(RecyclerNewArrayZ(this->m_scriptContext->GetRecycler(), Field(Var), GetConstantCount()));

        // Initialize with the root object, which will always be recorded here.
        Js::RootObjectBase * rootObject = this->LoadRootObject();
        if (rootObject)
        {
            this->RecordConstant(RootObjectRegSlot, rootObject);
        }
        else
        {
            Assert(false);
            this->RecordConstant(RootObjectRegSlot, this->m_scriptContext->GetLibrary()->GetUndefined());
        }

    }